

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::fetchGatherArray2DOffsets
          (tcu *this,ConstPixelBufferAccess *src,Sampler *sampler,float s,float t,int depth,
          int componentNdx,IVec2 (*offsets) [4])

{
  WrapMode WVar1;
  int size;
  int size_00;
  deInt32 dVar2;
  deInt32 dVar3;
  int iVar4;
  deBool dVar5;
  TextureFormat *format;
  float *pfVar6;
  float fVar7;
  float fVar8;
  ulong extraout_XMM0_Qa;
  ulong uVar9;
  Vec4 VVar11;
  tcu local_8c [8];
  float local_84 [2];
  tcu local_7c [8];
  float local_74 [2];
  undefined1 local_6c [8];
  Vec4 pixel;
  int sampleY;
  int sampleX;
  int i;
  int y0;
  int x0;
  float v;
  float u;
  int h;
  int w;
  IVec2 (*offsets_local) [4];
  int componentNdx_local;
  int depth_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *src_local;
  Vec4 *result;
  undefined8 uVar10;
  
  size = ConstPixelBufferAccess::getWidth(src);
  size_00 = ConstPixelBufferAccess::getHeight(src);
  fVar7 = unnormalize(sampler->wrapS,s,size);
  fVar8 = unnormalize(sampler->wrapT,t,size_00);
  dVar2 = deFloorFloatToInt32(fVar7 - 0.5);
  uVar10 = 0x3f000000;
  dVar3 = deFloorFloatToInt32(fVar8 - 0.5);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  sampleY = 0;
  uVar9 = extraout_XMM0_Qa;
  do {
    if (3 < sampleY) {
      VVar11.m_data[2] = (float)(int)uVar10;
      VVar11.m_data[3] = (float)(int)((ulong)uVar10 >> 0x20);
      VVar11.m_data[0] = (float)(int)uVar9;
      VVar11.m_data[1] = (float)(int)(uVar9 >> 0x20);
      return (Vec4)VVar11.m_data;
    }
    WVar1 = sampler->wrapS;
    iVar4 = Vector<int,_2>::x(*offsets + sampleY);
    pixel.m_data[3] = (float)wrap(WVar1,dVar2 + iVar4,size);
    WVar1 = sampler->wrapT;
    iVar4 = Vector<int,_2>::y(*offsets + sampleY);
    pixel.m_data[2] = (float)wrap(WVar1,dVar3 + iVar4,size_00);
    Vector<float,_4>::Vector((Vector<float,_4> *)local_6c);
    dVar5 = deInBounds32((int)pixel.m_data[3],0,size);
    if (dVar5 == 0) {
LAB_002f21c0:
      format = ConstPixelBufferAccess::getFormat(src);
      VVar11 = lookupBorder(local_8c,format,sampler);
      uVar10 = VVar11.m_data._8_8_;
      local_6c[0] = local_8c[0];
      local_6c[1] = local_8c[1];
      local_6c[2] = local_8c[2];
      local_6c[3] = local_8c[3];
      local_6c[4] = local_8c[4];
      local_6c[5] = local_8c[5];
      local_6c[6] = local_8c[6];
      local_6c[7] = local_8c[7];
      pixel.m_data[0] = local_84[0];
      pixel.m_data[1] = local_84[1];
    }
    else {
      dVar5 = deInBounds32((int)pixel.m_data[2],0,size_00);
      if (dVar5 == 0) goto LAB_002f21c0;
      VVar11 = lookup(local_7c,src,(int)pixel.m_data[3],(int)pixel.m_data[2],depth);
      uVar10 = VVar11.m_data._8_8_;
      local_6c[0] = local_7c[0];
      local_6c[1] = local_7c[1];
      local_6c[2] = local_7c[2];
      local_6c[3] = local_7c[3];
      local_6c[4] = local_7c[4];
      local_6c[5] = local_7c[5];
      local_6c[6] = local_7c[6];
      local_6c[7] = local_7c[7];
      pixel.m_data[0] = local_74[0];
      pixel.m_data[1] = local_74[1];
    }
    pfVar6 = Vector<float,_4>::operator[]((Vector<float,_4> *)local_6c,componentNdx);
    fVar7 = *pfVar6;
    pfVar6 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,sampleY);
    uVar9 = (ulong)(uint)fVar7;
    *pfVar6 = fVar7;
    sampleY = sampleY + 1;
  } while( true );
}

Assistant:

static Vec4 fetchGatherArray2DOffsets (const ConstPixelBufferAccess& src, const Sampler& sampler, float s, float t, int depth, int componentNdx, const IVec2 (&offsets)[4])
{
	DE_ASSERT(de::inBounds(componentNdx, 0, 4));

	const int		w	= src.getWidth();
	const int		h	= src.getHeight();
	const float		u	= unnormalize(sampler.wrapS, s, w);
	const float		v	= unnormalize(sampler.wrapT, t, h);
	const int		x0	= deFloorFloatToInt32(u-0.5f);
	const int		y0	= deFloorFloatToInt32(v-0.5f);

	Vec4			result;

	for (int i = 0; i < 4; i++)
	{
		const int	sampleX	= wrap(sampler.wrapS, x0 + offsets[i].x(), w);
		const int	sampleY	= wrap(sampler.wrapT, y0 + offsets[i].y(), h);
		Vec4		pixel;

		if (deInBounds32(sampleX, 0, w) && deInBounds32(sampleY, 0, h))
			pixel = lookup(src, sampleX, sampleY, depth);
		else
			pixel = lookupBorder(src.getFormat(), sampler);

		result[i] = pixel[componentNdx];
	}

	return result;
}